

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ImGuiContext *pIVar4;
  float *pfVar5;
  unsigned_long_long *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  ulong in_R8;
  ulong in_R9;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [64];
  float unaff_retaddr;
  undefined1 unaff_retaddr_00;
  unsigned_long_long in_stack_00000008;
  uint in_stack_00000010;
  undefined4 in_stack_00000014;
  float in_stack_00000018;
  ImGuiDataType in_stack_0000001c;
  float grab_pos;
  float grab_t;
  unsigned_long_long v_new_1;
  float new_clicked_t;
  unsigned_long_long v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  longlong v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_logarithmic;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  size_t in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  long local_f8;
  bool local_e9;
  undefined8 local_e8;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  ImGuiInputReadMode in_stack_ffffffffffffff28;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff2c;
  undefined8 local_d0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  float local_c0;
  float in_stack_ffffffffffffff44;
  ImVec2 in_stack_ffffffffffffff48;
  unsigned_long_long local_b0;
  float local_88;
  float local_84;
  float fStack_80;
  bool local_71;
  float local_4c;
  float zero_deadzone_halfsize_00;
  undefined1 extraout_var [56];
  
  pIVar4 = GImGui;
  bVar6 = (in_stack_00000010 & 0x100000) != 0;
  bVar7 = in_EDX == 8;
  bVar8 = in_EDX == 9;
  local_e9 = bVar7 || bVar8;
  bVar3 = false;
  if ((in_stack_00000010 & 0x20) != 0) {
    bVar3 = local_e9;
  }
  fVar9 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                             ,in_stack_fffffffffffffee8);
  fVar10 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8);
  fVar9 = (fVar9 - fVar10) - 4.0;
  local_4c = (pIVar4->Style).GrabMinSize;
  if (in_R8 < in_R9) {
    local_f8 = in_R9 - in_R8;
  }
  else {
    local_f8 = in_R8 - in_R9;
  }
  local_84 = in_stack_fffffffffffffef8;
  if ((!bVar7 && !bVar8) && (-1 < local_f8)) {
    local_4c = ImMax<float>(fVar9 / (float)(local_f8 + 1),(pIVar4->Style).GrabMinSize);
    local_84 = in_stack_fffffffffffffef8;
  }
  zero_deadzone_halfsize_00 = (float)(in_R9 >> 0x20);
  fVar11 = ImMin<float>(local_4c,fVar9);
  fVar15 = fVar9 - fVar11;
  fVar10 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8);
  fVar10 = fVar11 * 0.5 + fVar10 + 2.0;
  fVar12 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8);
  if (bVar3) {
    if (bVar7 || bVar8) {
      in_stack_ffffffffffffff04 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_fffffffffffffefc,local_84),
                      (int)in_stack_fffffffffffffef4);
    }
    else {
      in_stack_ffffffffffffff04 = 1;
    }
    ImPow(0.0,3.019514e-39);
    in_stack_ffffffffffffff00 = (pIVar4->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(fVar15,1.0);
  }
  local_71 = false;
  if (pIVar4->ActiveId == in_ESI) {
    bVar3 = false;
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar4->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar5 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                    in_stack_fffffffffffffee8);
        if (fVar15 <= 0.0) {
          in_stack_fffffffffffffefc = 0.0;
        }
        else {
          in_stack_fffffffffffffefc = ImClamp<float>((*pfVar5 - fVar10) / fVar15,0.0,1.0);
        }
        bVar3 = true;
      }
    }
    else if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar4->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar4->SliderCurrentAccum = 0.0;
        pIVar4->SliderCurrentAccumDirty = false;
      }
      auVar16._0_8_ =
           GetNavInputAmount2d(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
                               in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
      auVar16._8_56_ = extraout_var;
      uVar1 = vmovlpd_avx(auVar16._0_16_);
      if (bVar6) {
        fStack_80 = (float)((ulong)uVar1 >> 0x20);
        local_84 = -fStack_80;
      }
      else {
        local_84 = (float)uVar1;
      }
      if ((local_84 != 0.0) || (NAN(local_84))) {
        fVar15 = local_84;
        if (bVar7 || bVar8) {
          in_stack_fffffffffffffef4 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffefc,local_84),
                                 (int)in_stack_fffffffffffffef4);
        }
        else {
          in_stack_fffffffffffffef4 = 0.0;
        }
        if ((int)in_stack_fffffffffffffef4 < 1) {
          if (((-100.0 <= (float)local_f8) && ((float)local_f8 <= 100.0)) ||
             (bVar7 = IsNavInputDown(0xe), bVar7)) {
            auVar2 = vcmpss_avx(ZEXT416((uint)local_84),ZEXT816(0) << 0x40,1);
            auVar2 = vblendvps_avx(SUB6416(ZEXT464(0x3f800000),0),SUB6416(ZEXT464(0xbf800000),0),
                                   auVar2);
            local_88 = auVar2._0_4_ / (float)local_f8;
          }
          else {
            local_88 = local_84 / 100.0;
          }
        }
        else {
          local_88 = local_84 / 100.0;
          bVar7 = IsNavInputDown(0xe);
          if (bVar7) {
            local_88 = local_88 / 10.0;
          }
        }
        bVar7 = IsNavInputDown(0xf);
        if (bVar7) {
          local_88 = local_88 * 10.0;
        }
        pIVar4->SliderCurrentAccum = local_88 + pIVar4->SliderCurrentAccum;
        pIVar4->SliderCurrentAccumDirty = true;
        local_84 = fVar15;
      }
      fVar15 = pIVar4->SliderCurrentAccum;
      if ((pIVar4->NavActivatePressedId == in_ESI) && ((pIVar4->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar4->SliderCurrentAccumDirty & 1U) != 0) {
        fVar13 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                           ((ImGuiDataType)unaff_retaddr,(unsigned_long_long)in_RDI,
                            CONCAT44(in_ESI,in_EDX),(unsigned_long_long)in_RCX,
                            SUB81(in_R8 >> 0x38,0),(float)in_R8,zero_deadzone_halfsize_00);
        if (((1.0 <= fVar13) && (0.0 < fVar15)) || ((fVar13 <= 0.0 && (fVar15 < 0.0)))) {
          bVar3 = false;
          pIVar4->SliderCurrentAccum = 0.0;
        }
        else {
          bVar3 = true;
          ImSaturate(fVar13 + fVar15);
          ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                    (in_stack_0000001c,in_stack_00000018,
                     CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                     (bool)unaff_retaddr_00,unaff_retaddr,(float)((ulong)in_RDI >> 0x20));
          if ((in_stack_00000010 & 0x40) == 0) {
            RoundScalarWithFormatT<unsigned_long_long,long_long>
                      ((char *)in_stack_ffffffffffffff48,(ImGuiDataType)in_stack_ffffffffffffff44,
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          }
          fVar14 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                             ((ImGuiDataType)unaff_retaddr,(unsigned_long_long)in_RDI,
                              CONCAT44(in_ESI,in_EDX),(unsigned_long_long)in_RCX,
                              SUB81(in_R8 >> 0x38,0),(float)in_R8,zero_deadzone_halfsize_00);
          if (fVar15 <= 0.0) {
            fVar15 = ImMax<float>(fVar14 - fVar13,fVar15);
            pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar15;
          }
          else {
            fVar15 = ImMin<float>(fVar14 - fVar13,fVar15);
            pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar15;
          }
        }
        pIVar4->SliderCurrentAccumDirty = false;
      }
    }
    if (bVar3) {
      local_b0 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                           (in_stack_0000001c,in_stack_00000018,
                            CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                            (bool)unaff_retaddr_00,unaff_retaddr,(float)((ulong)in_RDI >> 0x20));
      if ((in_stack_00000010 & 0x40) == 0) {
        local_b0 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                             ((char *)in_stack_ffffffffffffff48,
                              (ImGuiDataType)in_stack_ffffffffffffff44,
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      local_71 = *in_RCX != local_b0;
      if (local_71) {
        *in_RCX = local_b0;
      }
    }
  }
  if (1.0 <= fVar9) {
    fVar9 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                      ((ImGuiDataType)unaff_retaddr,(unsigned_long_long)in_RDI,
                       CONCAT44(in_ESI,in_EDX),(unsigned_long_long)in_RCX,SUB81(in_R8 >> 0x38,0),
                       (float)in_R8,zero_deadzone_halfsize_00);
    if (bVar6) {
      fVar9 = 1.0 - fVar9;
    }
    ImLerp<float>(fVar10,-fVar11 * 0.5 + (fVar12 - 2.0),fVar9);
    if (bVar6) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,local_84,in_stack_fffffffffffffef4,
                     in_stack_fffffffffffffef0);
      *(undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = local_e8;
      ((undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018))[1] =
           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,local_84,in_stack_fffffffffffffef4,
                     in_stack_fffffffffffffef0);
      *(undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018) =
           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      ((undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018))[1] = local_d0;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_c0,in_RDI,in_RDI);
    *(undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018) =
         CONCAT44(in_stack_ffffffffffffff44,local_c0);
    *(ImVec2 *)((undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018) + 1) =
         in_stack_ffffffffffffff48;
  }
  return local_71;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}